

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.cpp
# Opt level: O1

void __thiscall
qclab::qgates::CPhase<std::complex<float>_>::apply
          (CPhase<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  Phase<std::complex<float>_> *pPVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_16_2_357f297d f;
  int *local_58 [2];
  long local_48;
  anon_class_16_2_357f297d local_40;
  
  (*(this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
    super_QObject<std::complex<float>_>._vptr_QObject[5])(local_58,this);
  *local_58[0] = *local_58[0] + offset;
  local_58[0][1] = local_58[0][1] + offset;
  iVar1 = (this->super_QControlledGate2<std::complex<float>_>).control_;
  iVar3 = (*(this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[0xf])(this);
  pPVar2 = (this->gate_)._M_t.
           super___uniq_ptr_impl<qclab::qgates::Phase<std::complex<float>_>,_std::default_delete<qclab::qgates::Phase<std::complex<float>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_qclab::qgates::Phase<std::complex<float>_>_*,_std::default_delete<qclab::qgates::Phase<std::complex<float>_>_>_>
           .super__Head_base<0UL,_qclab::qgates::Phase<std::complex<float>_>_*,_false>._M_head_impl;
  local_40.vector =
       (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  if (op == ConjTrans) {
    local_40.lambda._M_value = (ulong)pPVar2->angle_ ^ 0x8000000000000000;
  }
  else {
    local_40.lambda._M_value = *(_ComplexT *)&pPVar2->angle_;
  }
  apply4b<qclab::qgates::lambda_Phase<std::complex<float>>(qclab::Op,std::complex<float>&,std::complex<float>*)::_lambda(unsigned_long)_1_>
            (nbQubits,*local_58[0],local_58[0][1],iVar1 + offset,iVar3 + offset,
             (this->super_QControlledGate2<std::complex<float>_>).controlState_,&local_40);
  if (local_58[0] != (int *)0x0) {
    operator_delete(local_58[0],local_48 - (long)local_58[0]);
  }
  return;
}

Assistant:

void CPhase< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    T lambda = T( cos() , sin() ) ;
    auto f = lambda_Phase( op , lambda , vector.data() ) ;
    apply4b( nbQubits , qubits[0] , qubits[1] , control , target ,
             this->controlState() , f ) ;
  }